

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O3

void __thiscall
Parser::Parser(Parser *this,ofstream *out_file,Tokenizer *tokenizer,VM_Writer *vm_writer)

{
  _Rb_tree_header *p_Var1;
  long *plVar2;
  long lVar3;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  __l;
  allocator_type local_e2;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_e1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_d0;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined4 local_88;
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  undefined4 local_60;
  long *local_58 [2];
  long local_48 [2];
  undefined4 local_38;
  
  this->out_file = out_file;
  this->tokenizer = tokenizer;
  local_d8 = &(this->cur_token).field_2;
  (this->cur_token)._M_dataplus._M_p = (pointer)local_d8;
  (this->cur_token)._M_string_length = 0;
  (this->cur_token).field_2._M_local_buf[0] = '\0';
  local_e0 = &(this->prev_token).field_2;
  (this->prev_token)._M_dataplus._M_p = (pointer)local_e0;
  (this->prev_token)._M_string_length = 0;
  (this->prev_token).field_2._M_local_buf[0] = '\0';
  (this->class_name)._M_dataplus._M_p = (pointer)&(this->class_name).field_2;
  (this->class_name)._M_string_length = 0;
  (this->class_name).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->symbol_table).class_scope._M_t._M_impl.super__Rb_tree_header;
  (this->symbol_table).class_scope._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->symbol_table).class_scope._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->symbol_table).class_scope._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->symbol_table).class_scope._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->symbol_table).class_scope._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->symbol_table).subroutine_scope._M_t._M_impl.super__Rb_tree_header;
  (this->symbol_table).subroutine_scope._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->symbol_table).subroutine_scope._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->symbol_table).subroutine_scope._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->symbol_table).subroutine_scope._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->symbol_table).subroutine_scope._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->symbol_table).functions._M_t._M_impl.super__Rb_tree_header;
  (this->symbol_table).functions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->symbol_table).functions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->symbol_table).functions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->symbol_table).functions._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->symbol_table).temp_n_args = 0;
  (this->symbol_table).label_count = 0;
  (this->symbol_table).var_count = 0;
  (this->symbol_table).arg_count = 0;
  (this->symbol_table).method_count = 0;
  (this->symbol_table).function_count = 0;
  (this->symbol_table).functions._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->symbol_table).static_count = 0;
  (this->symbol_table).field_count = 0;
  this->vm_writer = vm_writer;
  (this->cur_subroutine_type)._M_dataplus._M_p = (pointer)&(this->cur_subroutine_type).field_2;
  (this->cur_subroutine_type)._M_string_length = 0;
  (this->cur_subroutine_type).field_2._M_local_buf[0] = '\0';
  local_d0.first._M_dataplus._M_p = (pointer)&local_d0.first.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"true","");
  local_d0.second = 1;
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"false","");
  local_88 = 1;
  local_80[0] = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"null","");
  local_60 = 1;
  plVar2 = local_48;
  local_58[0] = plVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"this","");
  local_38 = 1;
  __l._M_len = 4;
  __l._M_array = &local_d0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map(&this->keyword_constant_map,__l,&local_e1,&local_e2);
  lVar3 = -0xa0;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      operator_delete((long *)plVar2[-2],*plVar2 + 1);
    }
    plVar2 = plVar2 + -5;
    lVar3 = lVar3 + 0x28;
  } while (lVar3 != 0);
  query_tokenizer(this);
  parse_class(this);
  return;
}

Assistant:

Parser(std::ofstream& out_file, Tokenizer& tokenizer, VM_Writer& vm_writer): out_file(out_file),
            tokenizer(tokenizer), vm_writer(vm_writer)
    {
        query_tokenizer();
        parse_class();
    }